

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateMIPSAssembly.cpp
# Opt level: O2

string * getValueOfVarIml(string *__return_storage_ptr__,function *fn,string *varName,
                         string *varName1,Identifier *var,varType type)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  identifierCategory iVar4;
  int iVar5;
  int iVar6;
  varType vVar7;
  varType vVar8;
  tokenCategory tVar9;
  long lVar10;
  reference pvVar11;
  char *pcVar12;
  size_type sVar13;
  mapped_type *pmVar14;
  ostream *poVar15;
  mapped_type *pmVar16;
  bool *pbVar17;
  size_type sVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  string *psVar20;
  string name0_1;
  string name0;
  string realName2;
  string vn_3;
  string realName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elements;
  string local_3a0;
  stringstream stream2;
  undefined4 uStack_37c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370 [23];
  string local_1f8;
  string local_1d8;
  stringstream stream;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  lVar10 = std::__cxx11::string::find((char)varName,0x5b);
  if (lVar10 == -1) {
    if (var->initialized == true) {
      iVar4 = Identifier::getIdCategory(var);
      if (iVar4 != CONST) goto LAB_001211de;
      tVar9 = tokenType::getTokenCategory(&var->super_tokenType);
      if (tVar9 != CHARTK) {
        iVar3 = Identifier::getIntValue(var,0);
        std::ostream::operator<<(local_1a8,iVar3);
        std::__cxx11::stringbuf::str();
        goto LAB_00123190;
      }
      cVar2 = Identifier::getCharValue(var,0);
      std::operator<<(local_1a8,cVar2);
      std::__cxx11::stringbuf::str();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2,
                     "\'",&name0);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2,
                     "\'");
      std::__cxx11::string::~string((string *)&stream2);
    }
    else {
LAB_001211de:
      std::__cxx11::string::string((string *)&name0,(string *)varName1);
      for (sVar18 = 0; name0._M_string_length != sVar18; sVar18 = sVar18 + 1) {
        iVar3 = tolower((int)name0._M_dataplus._M_p[sVar18]);
        name0._M_dataplus._M_p[sVar18] = (char)iVar3;
      }
      bVar1 = function::varHasReg(fn,varName1);
      if (bVar1) {
        _stream2 = function::getRegOfVar(fn,varName1,true);
        pmVar16 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)&stream2);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar16);
      }
      else {
        bVar1 = function::stackHasVar(fn,varName1);
        if (!bVar1) {
          sVar13 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::count(&var2mem_abi_cxx11_,&name0);
          if (sVar13 == 0) {
            vVar7 = whatIsThisShit(varName1,fn);
            variableArrangeSpace(fn,varName1,vVar7);
            bVar1 = function::varHasReg(fn,varName1);
            if (bVar1) {
              _stream2 = function::getRegOfVar(fn,varName1,false);
              pmVar16 = std::
                        map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::at(&reg2str_abi_cxx11_,(key_type *)&stream2);
              std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar16);
            }
            else {
              iVar3 = function::getOffSet(fn,varName1);
              std::__cxx11::to_string(&name0_1,iVar3);
              std::operator+(&realName,"lw $t9 ",&name0_1);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stream2,&realName,"($sp)");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &mipsCode_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stream2);
              std::__cxx11::string::~string((string *)&stream2);
              std::__cxx11::string::~string((string *)&realName);
              std::__cxx11::string::~string((string *)&name0_1);
              _stream2 = 0x19;
              pmVar16 = std::
                        map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::at(&reg2str_abi_cxx11_,(key_type *)&stream2);
              std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar16);
            }
            goto LAB_00121d24;
          }
        }
        bVar1 = function::stackHasVar(fn,varName1);
        if (bVar1) {
          iVar3 = function::getOffSet(fn,varName1);
          std::__cxx11::to_string(&name0_1,iVar3);
          std::operator+(&realName,"lw $t9 ",&name0_1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stream2,&realName,"($sp)");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
          std::__cxx11::string::~string((string *)&stream2);
          std::__cxx11::string::~string((string *)&realName);
          std::__cxx11::string::~string((string *)&name0_1);
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)&stream2);
          std::__cxx11::string::string((string *)&realName,(string *)varName);
          for (sVar18 = 0; realName._M_string_length != sVar18; sVar18 = sVar18 + 1) {
            iVar3 = tolower((int)realName._M_dataplus._M_p[sVar18]);
            realName._M_dataplus._M_p[sVar18] = (char)iVar3;
          }
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(&var2mem_abi_cxx11_,&realName);
          iVar3 = *pmVar14;
          poVar15 = std::operator<<((ostream *)local_370[0]._M_local_buf,"0x");
          *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
               *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::ostream::operator<<(poVar15,iVar3);
          std::__cxx11::stringbuf::str();
          std::operator+(&name0_1,"lw $t9 ",&realName2);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&name0_1);
          std::__cxx11::string::~string((string *)&name0_1);
          std::__cxx11::string::~string((string *)&realName2);
          std::__cxx11::string::~string((string *)&realName);
          std::__cxx11::stringstream::~stringstream((stringstream *)&stream2);
        }
        _stream2 = 0x19;
        pmVar16 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)&stream2);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar16);
      }
    }
LAB_00121d24:
    std::__cxx11::string::~string((string *)&name0);
    goto LAB_00123190;
  }
  std::__cxx11::string::string((string *)&local_1d8,(string *)varName);
  boomVec(&elements,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  if ((long)elements.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)elements.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(&elements,0);
    pcVar12 = (char *)std::__cxx11::string::at((ulong)pvVar11);
    if (9 < (int)*pcVar12 - 0x30U) {
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at(&elements,0);
      std::__cxx11::string::string((string *)&name0,(string *)pvVar11);
      getRealName(&realName,&name0,'[');
      vVar7 = whatIsThisShit(&realName,fn);
      if (vVar7 == TEMP_VAR) {
        bVar1 = function::varHasReg(fn,&name0);
        if (bVar1) {
          realName2._M_dataplus._M_p._0_4_ = function::getRegOfVar(fn,&name0,true);
          pmVar16 = std::
                    map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::at(&reg2str_abi_cxx11_,(key_type *)&realName2);
          std::operator+(&name0_1,"sll $t8 ",pmVar16);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stream2,&name0_1," 2");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
          std::__cxx11::string::~string((string *)&stream2);
          psVar20 = &name0_1;
          goto LAB_00121f26;
        }
        iVar3 = function::getOffsetOfTemp(fn,&name0,true);
        std::__cxx11::to_string(&realName2,iVar3);
        std::operator+(&name0_1,"lw $t8 ",&realName2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2
                       ,&name0_1,"($sp)");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
        std::__cxx11::string::~string((string *)&stream2);
        std::__cxx11::string::~string((string *)&name0_1);
        std::__cxx11::string::~string((string *)&realName2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[14]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
      }
      else {
        getValueOfVar((string *)&stream2,&name0,fn);
        vVar7 = whatIsThisShit((string *)&stream2,fn);
        if (vVar7 == TEMP_VAR) {
          std::operator+(&realName2,"sll $t8 ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stream2);
          std::operator+(&name0_1,&realName2," 2");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&name0_1);
        }
        else {
          iVar3 = std::__cxx11::stoi((string *)&stream2,(size_t *)0x0,10);
          std::__cxx11::to_string(&realName2,iVar3 << 2);
          std::operator+(&name0_1,"li $t8 ",&realName2);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&name0_1);
        }
        std::__cxx11::string::~string((string *)&name0_1);
        std::__cxx11::string::~string((string *)&realName2);
        psVar20 = (string *)&stream2;
LAB_00121f26:
        std::__cxx11::string::~string((string *)psVar20);
      }
      if (type == LOCAL_VAR) {
        iVar3 = function::getOffSet(fn,varName1);
        std::__cxx11::to_string(&name0_1,iVar3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2
                       ,"li $t9 ",&name0_1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
        std::__cxx11::string::~string((string *)&stream2);
        std::__cxx11::string::~string((string *)&name0_1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[16]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream2);
        std::__cxx11::string::string((string *)&name0_1,(string *)varName1);
        for (sVar18 = 0; name0_1._M_string_length != sVar18; sVar18 = sVar18 + 1) {
          iVar3 = tolower((int)name0_1._M_dataplus._M_p[sVar18]);
          name0_1._M_dataplus._M_p[sVar18] = (char)iVar3;
        }
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::at(&var2mem_abi_cxx11_,&name0_1);
        iVar3 = *pmVar14;
        poVar15 = std::operator<<((ostream *)local_370[0]._M_local_buf,"0x");
        *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
             *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar15,iVar3);
        std::__cxx11::stringbuf::str();
        std::operator+(&realName2,"li $t9 ",&vn_3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,&realName2);
        std::__cxx11::string::~string((string *)&realName2);
        std::__cxx11::string::~string((string *)&vn_3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
        std::__cxx11::string::~string((string *)&name0_1);
        std::__cxx11::stringstream::~stringstream((stringstream *)&stream2);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[13]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
      _stream2 = 0x19;
      pmVar16 = std::
                map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::at(&reg2str_abi_cxx11_,(key_type *)&stream2);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar16);
      goto LAB_0012316c;
    }
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(&elements,0);
    iVar3 = std::__cxx11::stoi(pvVar11,(size_t *)0x0,10);
    std::__cxx11::to_string(&name0,iVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2,
                   "li $t8 ",&name0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
    std::__cxx11::string::~string((string *)&stream2);
    std::__cxx11::string::~string((string *)&name0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[14]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
    if (type == LOCAL_VAR) {
      iVar3 = function::getOffSet(fn,varName1);
      std::__cxx11::to_string(&name0,iVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2,
                     "li $t9 ",&name0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
      std::__cxx11::string::~string((string *)&stream2);
      std::__cxx11::string::~string((string *)&name0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[16]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&stream2);
      std::__cxx11::string::string((string *)&name0,(string *)varName1);
      for (sVar18 = 0; name0._M_string_length != sVar18; sVar18 = sVar18 + 1) {
        iVar3 = tolower((int)name0._M_dataplus._M_p[sVar18]);
        name0._M_dataplus._M_p[sVar18] = (char)iVar3;
      }
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::at(&var2mem_abi_cxx11_,&name0);
      iVar3 = *pmVar14;
      poVar15 = std::operator<<((ostream *)local_370[0]._M_local_buf,"0x");
      *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
           *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::operator<<(poVar15,iVar3);
      std::__cxx11::stringbuf::str();
      std::operator+(&realName,"li $t9 ",&name0_1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,&realName);
      std::__cxx11::string::~string((string *)&realName);
      std::__cxx11::string::~string((string *)&name0_1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
      std::__cxx11::string::~string((string *)&name0);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream2);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[13]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
    _stream2 = 0x19;
    pmVar16 = std::
              map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(&reg2str_abi_cxx11_,(key_type *)&stream2);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar16);
  }
  else {
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(&elements,0);
    pcVar12 = (char *)std::__cxx11::string::at((ulong)pvVar11);
    if ((int)*pcVar12 - 0x30U < 10) {
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at(&elements,1);
      pcVar12 = (char *)std::__cxx11::string::at((ulong)pvVar11);
      if ((int)*pcVar12 - 0x30U < 10) {
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at(&elements,0);
        iVar3 = std::__cxx11::stoi(pvVar11,(size_t *)0x0,10);
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at(&elements,1);
        iVar5 = std::__cxx11::stoi(pvVar11,(size_t *)0x0,10);
        iVar6 = Identifier::getDimension(var,2);
        std::__cxx11::to_string(&name0,iVar6 * iVar3 + iVar5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2
                       ,"li $t8 ",&name0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
        std::__cxx11::string::~string((string *)&stream2);
        std::__cxx11::string::~string((string *)&name0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[14]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
        if (type == LOCAL_VAR) {
          iVar3 = function::getOffSet(fn,varName1);
          std::__cxx11::to_string(&name0,iVar3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stream2,"li $t9 ",&name0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
          std::__cxx11::string::~string((string *)&stream2);
          std::__cxx11::string::~string((string *)&name0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[16]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)&stream2);
          std::__cxx11::string::string((string *)&name0,(string *)varName1);
          for (sVar18 = 0; name0._M_string_length != sVar18; sVar18 = sVar18 + 1) {
            iVar3 = tolower((int)name0._M_dataplus._M_p[sVar18]);
            name0._M_dataplus._M_p[sVar18] = (char)iVar3;
          }
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(&var2mem_abi_cxx11_,&name0);
          iVar3 = *pmVar14;
          poVar15 = std::operator<<((ostream *)local_370[0]._M_local_buf,"0x");
          *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
               *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::ostream::operator<<(poVar15,iVar3);
          std::__cxx11::stringbuf::str();
          std::operator+(&realName,"li $t9 ",&name0_1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&realName);
          std::__cxx11::string::~string((string *)&realName);
          std::__cxx11::string::~string((string *)&name0_1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
          std::__cxx11::string::~string((string *)&name0);
          std::__cxx11::stringstream::~stringstream((stringstream *)&stream2);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
        _stream2 = 0x19;
        pmVar16 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)&stream2);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar16);
        goto LAB_00123183;
      }
    }
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(&elements,0);
    pcVar12 = (char *)std::__cxx11::string::at((ulong)pvVar11);
    if ((int)*pcVar12 - 0x30U < 10) {
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at(&elements,1);
      pcVar12 = (char *)std::__cxx11::string::at((ulong)pvVar11);
      if (9 < (int)*pcVar12 - 0x30U) {
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at(&elements,0);
        iVar3 = std::__cxx11::stoi(pvVar11,(size_t *)0x0,10);
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at(&elements,1);
        std::__cxx11::string::string((string *)&name0,(string *)pvVar11);
        getRealName(&realName,&name0,'[');
        vVar7 = whatIsThisShit(&realName,fn);
        if (vVar7 == TEMP_VAR) {
          bVar1 = function::varHasReg(fn,&name0);
          if (bVar1) {
            realName2._M_dataplus._M_p._0_4_ = function::getRegOfVar(fn,&name0,true);
            pmVar16 = std::
                      map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::at(&reg2str_abi_cxx11_,(key_type *)&realName2);
            std::operator+(&name0_1,"sll $t8 ",pmVar16);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stream2,&name0_1," 2");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2
                      );
            std::__cxx11::string::~string((string *)&stream2);
            psVar20 = &name0_1;
            goto LAB_00122b3f;
          }
          iVar5 = function::getOffsetOfTemp(fn,&name0,true);
          std::__cxx11::to_string(&realName2,iVar5);
          std::operator+(&name0_1,"lw $t8 ",&realName2);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stream2,&name0_1,"($sp)");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
          std::__cxx11::string::~string((string *)&stream2);
          std::__cxx11::string::~string((string *)&name0_1);
          std::__cxx11::string::~string((string *)&realName2);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[14]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
        }
        else {
          getValueOfVar((string *)&stream2,&name0,fn);
          vVar7 = whatIsThisShit((string *)&stream2,fn);
          if (vVar7 == TEMP_VAR) {
            std::operator+(&realName2,"sll $t8 ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stream2);
            std::operator+(&name0_1,&realName2," 2");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,&name0_1);
          }
          else {
            iVar5 = std::__cxx11::stoi((string *)&stream2,(size_t *)0x0,10);
            std::__cxx11::to_string(&realName2,iVar5 << 2);
            std::operator+(&name0_1,"li $t8 ",&realName2);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,&name0_1);
          }
          std::__cxx11::string::~string((string *)&name0_1);
          std::__cxx11::string::~string((string *)&realName2);
          psVar20 = (string *)&stream2;
LAB_00122b3f:
          std::__cxx11::string::~string((string *)psVar20);
        }
        if (type == LOCAL_VAR) {
          iVar5 = function::getOffSet(fn,varName1);
          iVar6 = Identifier::getDimension(var,2);
          std::__cxx11::to_string(&name0_1,iVar5 + iVar3 * iVar6 * -4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stream2,"li $t9 ",&name0_1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
          std::__cxx11::string::~string((string *)&stream2);
          std::__cxx11::string::~string((string *)&name0_1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[16]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)&stream2);
          std::__cxx11::string::string((string *)&name0_1,(string *)varName1);
          for (sVar18 = 0; name0_1._M_string_length != sVar18; sVar18 = sVar18 + 1) {
            iVar5 = tolower((int)name0_1._M_dataplus._M_p[sVar18]);
            name0_1._M_dataplus._M_p[sVar18] = (char)iVar5;
          }
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(&var2mem_abi_cxx11_,&name0_1);
          iVar5 = *pmVar14;
          iVar6 = Identifier::getDimension(var,2);
          poVar15 = std::operator<<((ostream *)local_370[0]._M_local_buf,"0x");
          *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
               *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::ostream::operator<<(poVar15,iVar5 + iVar3 * iVar6 * 4);
          std::__cxx11::stringbuf::str();
          std::operator+(&realName2,"li $t9 ",&vn_3);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&realName2);
          std::__cxx11::string::~string((string *)&realName2);
          std::__cxx11::string::~string((string *)&vn_3);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
          std::__cxx11::string::~string((string *)&name0_1);
          std::__cxx11::stringstream::~stringstream((stringstream *)&stream2);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
        _stream2 = 0x19;
        pmVar16 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)&stream2);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar16);
        goto LAB_0012316c;
      }
    }
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(&elements,0);
    pcVar12 = (char *)std::__cxx11::string::at((ulong)pvVar11);
    if (9 < (int)*pcVar12 - 0x30U) {
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at(&elements,1);
      pcVar12 = (char *)std::__cxx11::string::at((ulong)pvVar11);
      if ((int)*pcVar12 - 0x30U < 10) {
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at(&elements,1);
        iVar3 = std::__cxx11::stoi(pvVar11,(size_t *)0x0,10);
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at(&elements,0);
        std::__cxx11::string::string((string *)&name0,(string *)pvVar11);
        getRealName(&realName,&name0,'[');
        vVar7 = whatIsThisShit(&realName,fn);
        if (vVar7 == TEMP_VAR) {
          bVar1 = function::varHasReg(fn,&name0);
          if (bVar1) {
            local_3d8._M_dataplus._M_p._0_4_ = function::getRegOfVar(fn,&name0,true);
            pmVar16 = std::
                      map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::at(&reg2str_abi_cxx11_,(key_type *)&local_3d8);
            std::operator+(&realName2,"mul $t8 ",pmVar16);
            std::operator+(&name0_1,&realName2," ");
            iVar5 = Identifier::getDimension(var,2);
            std::__cxx11::to_string(&vn_3,iVar5 << 2);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stream2,&name0_1,&vn_3);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2
                      );
            std::__cxx11::string::~string((string *)&stream2);
            std::__cxx11::string::~string((string *)&vn_3);
            std::__cxx11::string::~string((string *)&name0_1);
            psVar20 = &realName2;
          }
          else {
            iVar5 = function::getOffsetOfTemp(fn,&name0,true);
            std::__cxx11::to_string(&realName2,iVar5);
            std::operator+(&name0_1,"lw $t8 ",&realName2);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stream2,&name0_1,"($sp)");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2
                      );
            std::__cxx11::string::~string((string *)&stream2);
            std::__cxx11::string::~string((string *)&name0_1);
            std::__cxx11::string::~string((string *)&realName2);
            iVar5 = Identifier::getDimension(var,2);
            std::__cxx11::to_string(&name0_1,iVar5 << 2);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stream2,"mul $t8 $t8 ",&name0_1);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2
                      );
            std::__cxx11::string::~string((string *)&stream2);
            psVar20 = &name0_1;
          }
        }
        else {
          getValueOfVar((string *)&stream2,&name0,fn);
          vVar7 = whatIsThisShit((string *)&stream2,fn);
          if (vVar7 == TEMP_VAR) {
            std::operator+(&vn_3,"mul $t8 ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stream2);
            std::operator+(&realName2,&vn_3," ");
            iVar5 = Identifier::getDimension(var,2);
            std::__cxx11::to_string(&local_3d8,iVar5 << 2);
            std::operator+(&name0_1,&realName2,&local_3d8);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,&name0_1);
            std::__cxx11::string::~string((string *)&name0_1);
            std::__cxx11::string::~string((string *)&local_3d8);
            std::__cxx11::string::~string((string *)&realName2);
            psVar20 = &vn_3;
          }
          else {
            iVar5 = std::__cxx11::stoi((string *)&stream2,(size_t *)0x0,10);
            iVar6 = Identifier::getDimension(var,2);
            std::__cxx11::to_string(&realName2,iVar5 * iVar6 * 4);
            std::operator+(&name0_1,"li $t8 ",&realName2);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,&name0_1);
            std::__cxx11::string::~string((string *)&name0_1);
            psVar20 = &realName2;
          }
          std::__cxx11::string::~string((string *)psVar20);
          psVar20 = (string *)&stream2;
        }
        std::__cxx11::string::~string((string *)psVar20);
        std::__cxx11::to_string(&name0_1,iVar3 << 2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2
                       ,"addi $t8 $t8 ",&name0_1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
        std::__cxx11::string::~string((string *)&stream2);
        std::__cxx11::string::~string((string *)&name0_1);
        if (type == LOCAL_VAR) {
          iVar3 = function::getOffSet(fn,varName1);
          std::__cxx11::to_string(&name0_1,iVar3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stream2,"li $t9 ",&name0_1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
          std::__cxx11::string::~string((string *)&stream2);
          std::__cxx11::string::~string((string *)&name0_1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[16]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)&stream2);
          std::__cxx11::string::string((string *)&name0_1,(string *)varName1);
          for (sVar18 = 0; name0_1._M_string_length != sVar18; sVar18 = sVar18 + 1) {
            iVar3 = tolower((int)name0_1._M_dataplus._M_p[sVar18]);
            name0_1._M_dataplus._M_p[sVar18] = (char)iVar3;
          }
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(&var2mem_abi_cxx11_,&name0_1);
          iVar3 = *pmVar14;
          poVar15 = std::operator<<((ostream *)local_370[0]._M_local_buf,"0x");
          *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
               *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::ostream::operator<<(poVar15,iVar3);
          std::__cxx11::stringbuf::str();
          std::operator+(&realName2,"li $t9 ",&vn_3);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&realName2);
          std::__cxx11::string::~string((string *)&realName2);
          std::__cxx11::string::~string((string *)&vn_3);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
          std::__cxx11::string::~string((string *)&name0_1);
          std::__cxx11::stringstream::~stringstream((stringstream *)&stream2);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
        _stream2 = 0x19;
        pmVar16 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)&stream2);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar16);
        goto LAB_0012316c;
      }
    }
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(&elements,0);
    std::__cxx11::string::string((string *)&name0,(string *)pvVar11);
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(&elements,1);
    std::__cxx11::string::string((string *)&realName,(string *)pvVar11);
    getRealName(&name0_1,&name0,'[');
    getRealName(&realName2,&realName,'[');
    vVar7 = whatIsThisShit(&name0_1,fn);
    vVar8 = whatIsThisShit(&realName2,fn);
    if (vVar7 == TEMP_VAR) {
      bVar1 = function::varHasReg(fn,&name0);
      if (bVar1) {
        local_1f8._M_dataplus._M_p._0_4_ = function::getRegOfVar(fn,&name0,true);
        pmVar16 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)&local_1f8);
        std::operator+(&local_3d8,"mul $t8 ",pmVar16);
        std::operator+(&vn_3,&local_3d8," ");
        iVar3 = Identifier::getDimension(var,2);
        std::__cxx11::to_string(&local_3a0,iVar3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2
                       ,&vn_3,&local_3a0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
        std::__cxx11::string::~string((string *)&stream2);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&vn_3);
        pbVar19 = &local_3d8;
      }
      else {
        iVar3 = function::getOffsetOfTemp(fn,&name0,true);
        std::__cxx11::to_string(&local_3d8,iVar3);
        std::operator+(&vn_3,"lw $t8 ",&local_3d8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2
                       ,&vn_3,"($sp)");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
        std::__cxx11::string::~string((string *)&stream2);
        std::__cxx11::string::~string((string *)&vn_3);
        std::__cxx11::string::~string((string *)&local_3d8);
        iVar3 = Identifier::getDimension(var,2);
        std::__cxx11::to_string(&vn_3,iVar3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2
                       ,"mul $t8 $t8 ",&vn_3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
        std::__cxx11::string::~string((string *)&stream2);
        pbVar19 = &vn_3;
      }
    }
    else {
      getValueOfVar((string *)&stream2,&name0,fn);
      vVar7 = whatIsThisShit((string *)&stream2,fn);
      if (vVar7 == TEMP_VAR) {
        std::operator+(&local_3a0,"mul $t8 ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2
                      );
        std::operator+(&local_3d8,&local_3a0," ");
        iVar3 = Identifier::getDimension(var,2);
        std::__cxx11::to_string(&local_1f8,iVar3);
        std::operator+(&vn_3,&local_3d8,&local_1f8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,&vn_3);
        std::__cxx11::string::~string((string *)&vn_3);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_3d8);
        psVar20 = &local_3a0;
      }
      else {
        iVar3 = std::__cxx11::stoi((string *)&stream2,(size_t *)0x0,10);
        iVar5 = Identifier::getDimension(var,2);
        std::__cxx11::to_string(&local_3d8,iVar5 * iVar3);
        std::operator+(&vn_3,"li $t8 ",&local_3d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,&vn_3);
        std::__cxx11::string::~string((string *)&vn_3);
        psVar20 = &local_3d8;
      }
      std::__cxx11::string::~string((string *)psVar20);
      pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2;
    }
    std::__cxx11::string::~string((string *)pbVar19);
    if (vVar8 == TEMP_VAR) {
      bVar1 = function::varHasReg(fn,&realName);
      if (bVar1) {
        vn_3._M_dataplus._M_p._0_4_ = function::getRegOfVar(fn,&realName,true);
        pmVar16 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)&vn_3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2
                       ,"addu $t8 $t8 ",pmVar16);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
        goto LAB_00122690;
      }
      iVar3 = function::getOffsetOfTemp(fn,&realName,true);
      std::__cxx11::to_string(&local_3d8,iVar3);
      std::operator+(&vn_3,"lw $t9 ",&local_3d8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2,
                     &vn_3,"($sp)");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
      std::__cxx11::string::~string((string *)&stream2);
      std::__cxx11::string::~string((string *)&vn_3);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $t9");
    }
    else {
      _stream2 = (pointer)local_370;
      local_370[0]._M_local_buf[0] = '\0';
      if (v1 == false) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"la $v1 ($t8)");
        std::__cxx11::string::assign((char *)&stream2);
        pbVar17 = &v1;
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"la $s7 ($t8)");
        std::__cxx11::string::assign((char *)&stream2);
        pbVar17 = &s7;
      }
      *pbVar17 = true;
      getValueOfVar(&vn_3,&realName,fn);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &stream2,"v1");
      if (bVar1) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"la $t8 ($v1)");
        pbVar17 = &v1;
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"la $t8 ($s7)");
        pbVar17 = &s7;
      }
      *pbVar17 = false;
      vVar7 = whatIsThisShit(&vn_3,fn);
      if (vVar7 == TEMP_VAR) {
        std::operator+(&local_3d8,"addu $t8 $t8 ",&vn_3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,&local_3d8);
        pbVar19 = &local_3d8;
      }
      else {
        iVar3 = std::__cxx11::stoi(&vn_3,(size_t *)0x0,10);
        std::__cxx11::to_string(&local_3a0,iVar3);
        std::operator+(&local_3d8,"addi $t8 $t8 ",&local_3a0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,&local_3d8);
        std::__cxx11::string::~string((string *)&local_3d8);
        pbVar19 = &local_3a0;
      }
      std::__cxx11::string::~string((string *)pbVar19);
      std::__cxx11::string::~string((string *)&vn_3);
LAB_00122690:
      std::__cxx11::string::~string((string *)&stream2);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[14]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
    if (type == LOCAL_VAR) {
      iVar3 = function::getOffSet(fn,varName1);
      std::__cxx11::to_string(&vn_3,iVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2,
                     "li $t9 ",&vn_3);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream2);
      std::__cxx11::string::~string((string *)&stream2);
      std::__cxx11::string::~string((string *)&vn_3);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[16]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&stream2);
      std::__cxx11::string::string((string *)&vn_3,(string *)varName1);
      lVar10 = CONCAT44(vn_3._M_dataplus._M_p._4_4_,(Reg)vn_3._M_dataplus._M_p);
      for (sVar18 = 0; vn_3._M_string_length != sVar18; sVar18 = sVar18 + 1) {
        iVar3 = tolower((int)*(char *)(lVar10 + sVar18));
        *(char *)(lVar10 + sVar18) = (char)iVar3;
      }
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::at(&var2mem_abi_cxx11_,&vn_3);
      iVar3 = *pmVar14;
      poVar15 = std::operator<<((ostream *)local_370[0]._M_local_buf,"0x");
      *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
           *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::operator<<(poVar15,iVar3);
      std::__cxx11::stringbuf::str();
      std::operator+(&local_3d8,"li $t9 ",&local_3a0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
      std::__cxx11::string::~string((string *)&vn_3);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream2);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[13]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
    _stream2 = 0x19;
    pmVar16 = std::
              map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(&reg2str_abi_cxx11_,(key_type *)&stream2);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar16);
    std::__cxx11::string::~string((string *)&realName2);
    std::__cxx11::string::~string((string *)&name0_1);
LAB_0012316c:
    std::__cxx11::string::~string((string *)&realName);
    std::__cxx11::string::~string((string *)&name0);
  }
LAB_00123183:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&elements);
LAB_00123190:
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

string getValueOfVarIml(function &fn, string &varName, string &varName1, Identifier var, enum varType type) {
    stringstream stream;
    if (varName.find('[') == string::npos) {//普通标识符
        if (var.initialized && var.getIdCategory() == CONST) {//是否是初始化变量
            if (var.getTokenCategory() == CHARTK) {
                stream << var.getCharValue(0);
                return "\'" + stream.str() + "\'";
            } else {
                stream << var.getIntValue(0);
                return stream.str();
            }
        } else {
            string name = varName1;
            transform(name.begin(), name.end(), name.begin(), ::tolower);
            if (fn.varHasReg(varName1)) {//寄存器中存在
                return reg2str.at(fn.getRegOfVar(varName1, true));
            } else if (fn.stackHasVar(varName1) || var2mem.count(name) != 0) {//堆或栈中存在
                int offset;
                if (fn.stackHasVar(varName1)) {
                    offset = fn.getOffSet(varName1);
                    mipsCode.emplace_back("lw $t9 " + to_string(offset) + "($sp)");
                } else {
                    stringstream stream2;
                    string name0 = varName;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    offset = var2mem.at(name0);
                    stream2 << "0x" << hex << offset;
                    mipsCode.emplace_back("lw $t9 " + stream2.str());
                }
                return reg2str.at($t9);
            } else {//分配
                variableArrangeSpace(fn, varName1, whatIsThisShit(varName1, fn));
                if (fn.varHasReg(varName1))
                    return reg2str.at(fn.getRegOfVar(varName1, false));
                else {
                    mipsCode.emplace_back("lw $t9 " + to_string(fn.getOffSet(varName1)) + "($sp)");
                    return reg2str.at($t9);
                }
            }
        }
    } else {
        vector<string> elements = boomVec(varName);
        if (elements.size() == 1) {//一维数组
            if (isdigit(elements.at(0).at(0))) {//数字下标
                int d1 = stoi(elements.at(0));
                mipsCode.emplace_back("li $t8 " + to_string(d1));
                mipsCode.emplace_back("sll $t8 $t8 2");
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else {//变量下标
                string index = elements.at(0);
                string realName = getRealName(index, '[');
                if (whatIsThisShit(realName, fn) == TEMP_VAR) {
                    if (fn.varHasReg(index))
                        mipsCode.emplace_back("sll $t8 " +
                                              reg2str.at(fn.getRegOfVar(index, true)) + " 2");
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index, true)) + "($sp)");
                        mipsCode.emplace_back("sll $t8 $t8 2");
                    }
                } else {
                    string vn = getValueOfVar(index, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("sll $t8 " + vn + " 2");
                    else//变量转数字
                        mipsCode.emplace_back("li $t8 " + to_string(stoi(vn) * 4));
                }
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            }
        } else {//二维数组
            if (isdigit(elements.at(0).at(0))
                && isdigit(elements.at(1).at(0))) {//两个都是数字下标
                int d1 = stoi(elements.at(0));
                int d2 = stoi(elements.at(1));
                int index = d1 * var.getDimension(2) + d2;
                mipsCode.emplace_back("li $t8 " + to_string(index));
                mipsCode.emplace_back("sll $t8 $t8 2");
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else if (isdigit(elements.at(0).at(0))
                       && !isdigit(elements.at(1).at(0))) {//第一维是数字下标，第二维不是
                int d1 = stoi(elements.at(0));
                string index = elements.at(1);
                string realName = getRealName(index, '[');
                if (whatIsThisShit(realName, fn) == TEMP_VAR) {
                    if (fn.varHasReg(index))
                        mipsCode.emplace_back("sll $t8 " +
                                              reg2str.at(fn.getRegOfVar(index, true)) + " 2");
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index, true)) + "($sp)");
                        mipsCode.emplace_back("sll $t8 $t8 2");
                    }
                } else {
                    string vn = getValueOfVar(index, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("sll $t8 " + vn + " 2");
                    else
                        mipsCode.emplace_back("li $t8 " + to_string(stoi(vn) * 4));
                }
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1) - d1 * var.getDimension(2) * 4;
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0) + d1 * var.getDimension(2) * 4;
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else if (!isdigit(elements.at(0).at(0))
                       && isdigit(elements.at(1).at(0))) {//第一维不是数字下标，第二维是
                int d2 = stoi(elements.at(1)) * 4;
                string index = elements.at(0);
                string realName = getRealName(index, '[');
                if (whatIsThisShit(realName, fn) == TEMP_VAR) {
                    if (fn.varHasReg(index))
                        mipsCode.emplace_back("mul $t8 " +
                                              reg2str.at(fn.getRegOfVar(index, true)) + " " +
                                              to_string(var.getDimension(2) * 4));
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index, true)) + "($sp)");
                        mipsCode.emplace_back("mul $t8 $t8 " + to_string(var.getDimension(2) * 4));
                    }
                } else {
                    string vn = getValueOfVar(index, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("mul $t8 " + vn + " " +
                                              to_string(var.getDimension(2) * 4));
                    else
                        mipsCode.emplace_back(
                                "li $t8 " + to_string(stoi(vn) * var.getDimension(2) * 4));
                }
                mipsCode.emplace_back("addi $t8 $t8 " + to_string(d2));
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else {//第一维和第二维都不是数字下标
                string index1 = elements.at(0);
                string index2 = elements.at(1);
                string realName1 = getRealName(index1, '[');
                string realName2 = getRealName(index2, '[');
                varType ty1 = whatIsThisShit(realName1, fn);
                varType ty2 = whatIsThisShit(realName2, fn);
                if (ty1 == TEMP_VAR) {
                    if (fn.varHasReg(index1))
                        mipsCode.emplace_back("mul $t8 " +
                                              reg2str.at(fn.getRegOfVar(index1, true)) + " " +
                                              to_string(var.getDimension(2)));
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index1, true)) + "($sp)");
                        mipsCode.emplace_back("mul $t8 $t8 " + to_string(var.getDimension(2)));
                    }
                } else {
                    string vn = getValueOfVar(index1, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("mul $t8 " + vn + " " +
                                              to_string(var.getDimension(2)));
                    else
                        mipsCode.emplace_back(
                                "li $t8 " + to_string(stoi(vn) * var.getDimension(2)));
                }
                if (ty2 == TEMP_VAR) {
                    if (fn.varHasReg(index2))
                        mipsCode.emplace_back("addu $t8 $t8 " + reg2str.at(fn.getRegOfVar(index2, true)));
                    else {
                        mipsCode.emplace_back("lw $t9 " + to_string(fn.getOffsetOfTemp(index2, true)) + "($sp)");
                        mipsCode.emplace_back("addu $t8 $t8 $t9");
                    }
                } else {
                    string choose;
                    if (!v1) {
                        mipsCode.emplace_back("la $v1 ($t8)");
                        choose = "v1";
                        v1 = true;
                    } else {
                        mipsCode.emplace_back("la $s7 ($t8)");
                        choose = "s7";
                        s7 = true;
                    }
                    string vn = getValueOfVar(index2, fn);
                    if (choose == "v1") {
                        mipsCode.emplace_back("la $t8 ($v1)");
                        v1 = false;
                    } else {
                        mipsCode.emplace_back("la $t8 ($s7)");
                        s7 = false;
                    }
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("addu $t8 $t8 " + vn);
                    else
                        mipsCode.emplace_back("addi $t8 $t8 " + to_string(stoi(vn)));
                }
                mipsCode.emplace_back("sll $t8 $t8 2");
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            }
        }
    }
}